

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitterByCenter.hpp
# Opt level: O0

void __thiscall
NBvh3::SplitterByCenter<NBvh3::KDop<16U>_>::SplitterByCenter
          (SplitterByCenter<NBvh3::KDop<16U>_> *this,TVertices *vertices,KDop<16U> *bv)

{
  float fVar1;
  float fVar2;
  SVertex SVar3;
  undefined1 local_30 [8];
  SVertex center;
  KDop<16U> *bv_local;
  TVertices *vertices_local;
  SplitterByCenter<NBvh3::KDop<16U>_> *this_local;
  
  unique0x100001c3 = bv;
  Splitter::Splitter(&this->super_Splitter);
  (this->super_Splitter)._vptr_Splitter = (_func_int **)&PTR_split_001af2a0;
  this->mVertices = vertices;
  this->mBv = stack0xffffffffffffffe0;
  this->mAxis = 2;
  this->mAxisValue = 0.0;
  SVar3 = KDop<16U>::getCenter(this->mBv);
  center.x = SVar3.z;
  local_30 = SVar3._0_8_;
  fVar1 = KDop<16U>::getWidth(this->mBv);
  fVar2 = KDop<16U>::getHeight(this->mBv);
  if (fVar2 <= fVar1) {
    fVar1 = KDop<16U>::getWidth(this->mBv);
    fVar2 = KDop<16U>::getDepth(this->mBv);
    if (fVar2 <= fVar1) {
      this->mAxis = 0;
      goto LAB_001597d0;
    }
  }
  fVar1 = KDop<16U>::getHeight(this->mBv);
  fVar2 = KDop<16U>::getWidth(this->mBv);
  if (fVar2 <= fVar1) {
    fVar1 = KDop<16U>::getHeight(this->mBv);
    fVar2 = KDop<16U>::getDepth(this->mBv);
    if (fVar2 <= fVar1) {
      this->mAxis = 1;
    }
  }
LAB_001597d0:
  fVar1 = SVertex::operator[]((SVertex *)local_30,this->mAxis);
  this->mAxisValue = fVar1;
  return;
}

Assistant:

SplitterByCenter<TBv>::SplitterByCenter(
    const TVertices& vertices,
    const TBv& bv
    )
    : mVertices(vertices)
    , mBv(bv)
    , mAxis(2)
    , mAxisValue(0)
{
    SVertex center = mBv.getCenter();

    if (mBv.getWidth() >= mBv.getHeight() && mBv.getWidth() >= mBv.getDepth())
    {
        mAxis = 0;
    }
    else if (mBv.getHeight() >= mBv.getWidth() && mBv.getHeight() >= mBv.getDepth())
    {
        mAxis = 1;
    }

    mAxisValue = center[mAxis];
}